

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O0

void __thiscall QLCDNumber::QLCDNumber(QLCDNumber *this,uint numDigits,QWidget *parent)

{
  long lVar1;
  EVP_PKEY_CTX *ctx;
  QLCDNumberPrivate *this_00;
  QWidget *in_RDX;
  int in_ESI;
  QFramePrivate *in_RDI;
  long in_FS_OFFSET;
  QLCDNumberPrivate *d;
  QLCDNumberPrivate *in_stack_ffffffffffffffc0;
  QFrame *in_stack_ffffffffffffffd0;
  QWidget *pQVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ctx = (EVP_PKEY_CTX *)operator_new(0x2c0);
  QLCDNumberPrivate::QLCDNumberPrivate(in_stack_ffffffffffffffc0);
  pQVar2 = in_RDX;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x5b9630);
  QFrame::QFrame(in_stack_ffffffffffffffd0,in_RDI,in_RDX,
                 (QFlagsStorageHelper<Qt::WindowType,_4>)SUB84((ulong)pQVar2 >> 0x20,0));
  *(undefined ***)&in_RDI->super_QWidgetPrivate = &PTR_metaObject_00d14bf0;
  *(undefined ***)&(in_RDI->super_QWidgetPrivate).field_0x10 = &PTR__QLCDNumber_00d14da8;
  this_00 = d_func((QLCDNumber *)0x5b966c);
  this_00->ndigits = in_ESI;
  QLCDNumberPrivate::init(this_00,ctx);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QLCDNumber::QLCDNumber(uint numDigits, QWidget *parent)
        : QFrame(*new QLCDNumberPrivate, parent)
{
    Q_D(QLCDNumber);
    d->ndigits = numDigits;
    d->init();
}